

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

StringEqualsMatcher * Catch::Matchers::Equals(string *str,CaseSensitive caseSensitivity)

{
  CasedString *in_RDI;
  CasedString *comparator;
  StringEqualsMatcher *in_stack_ffffffffffffffb0;
  CasedString local_40;
  
  comparator = &local_40;
  CasedString::CasedString(in_RDI,(string *)in_RDI,Yes);
  StringEqualsMatcher::StringEqualsMatcher(in_stack_ffffffffffffffb0,comparator);
  CasedString::~CasedString((CasedString *)0x185141);
  return (StringEqualsMatcher *)in_RDI;
}

Assistant:

StringEqualsMatcher Equals( std::string const& str, CaseSensitive caseSensitivity ) {
        return StringEqualsMatcher( CasedString( str, caseSensitivity) );
    }